

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::RedirectedStdOut::RedirectedStdOut(RedirectedStdOut *this)

{
  ostream *redirectionStream;
  RedirectedStream *in_RDI;
  ReusableStringStream *in_stack_ffffffffffffffc0;
  RedirectedStream *this_00;
  
  this_00 = in_RDI;
  ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffffc0);
  cout();
  redirectionStream = ReusableStringStream::get((ReusableStringStream *)in_RDI);
  RedirectedStream::RedirectedStream(this_00,(ostream *)in_RDI,redirectionStream);
  return;
}

Assistant:

RedirectedStdOut::RedirectedStdOut() : m_cout( Catch::cout(), m_rss.get() ) {}